

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O0

void __thiscall QWindowContainer::~QWindowContainer(QWindowContainer *this)

{
  bool bVar1;
  QWindow *pQVar2;
  undefined8 *in_RDI;
  QWindowContainerPrivate *d;
  QWidget *in_stack_00000068;
  
  *in_RDI = &PTR_metaObject_00d090c0;
  in_RDI[2] = &PTR__QWindowContainer_00d09270;
  d_func((QWindowContainer *)0x3ba70b);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWindow> *)0x3ba721);
  if (bVar1) {
    pQVar2 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba738);
    QObject::removeEventFilter((QObject *)pQVar2);
    QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3ba756);
    QWindow::destroy();
  }
  pQVar2 = ::QPointer::operator_cast_to_QWindow_((QPointer<QWindow> *)0x3ba76f);
  if (pQVar2 != (QWindow *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  QWidget::~QWidget(in_stack_00000068);
  return;
}

Assistant:

QWindowContainer::~QWindowContainer()
{
    Q_D(QWindowContainer);

    // Call destroy() explicitly first. The dtor would do this too, but
    // QEvent::PlatformSurface delivery relies on virtuals. Getting
    // SurfaceAboutToBeDestroyed can be essential for OpenGL, Vulkan, etc.
    // QWindow subclasses in particular. Keep these working.
    if (d->window) {
        d->window->removeEventFilter(this);
        d->window->destroy();
    }

    delete d->window;
}